

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_test.cc
# Opt level: O3

void __thiscall anon_unknown.dwarf_18d2769::LevelTest::SetUp(LevelTest *this)

{
  libaom_test::EncoderTest::InitializeConfig
            (&this->super_EncoderTest,*(TestMode *)&(this->super_EncoderTest).field_0x3dc);
  if (*(int *)&(this->super_EncoderTest).field_0x3dc == 0) {
    (this->super_EncoderTest).cfg_.rc_buf_sz = 1000;
    (this->super_EncoderTest).cfg_.rc_buf_initial_sz = 500;
    (this->super_EncoderTest).cfg_.rc_buf_optimal_sz = 600;
  }
  else {
    (this->super_EncoderTest).cfg_.g_lag_in_frames = 5;
  }
  return;
}

Assistant:

void SetUp() override {
    InitializeConfig(encoding_mode_);
    if (encoding_mode_ != ::libaom_test::kRealTime) {
      cfg_.g_lag_in_frames = 5;
    } else {
      cfg_.rc_buf_sz = 1000;
      cfg_.rc_buf_initial_sz = 500;
      cfg_.rc_buf_optimal_sz = 600;
    }
  }